

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O3

FT_Error TT_Load_Context(TT_ExecContext exec,TT_Face face,TT_Size size)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ushort uVar3;
  FT_Size_Metrics *pFVar4;
  FT_Memory pFVar5;
  FT_Fixed FVar6;
  FT_Fixed FVar7;
  FT_Pos FVar8;
  FT_Pos FVar9;
  undefined8 uVar10;
  FT_Vector *pFVar11;
  FT_Vector *pFVar12;
  FT_Vector *pFVar13;
  FT_UShort *pFVar14;
  FT_UInt FVar15;
  FT_UShort FVar16;
  FT_UShort FVar17;
  undefined4 uVar18;
  FT_F2Dot14 FVar19;
  FT_Short FVar20;
  FT_Short FVar21;
  FT_UShort FVar22;
  undefined6 uVar23;
  FT_Error FVar24;
  FT_Byte *pFVar25;
  long lVar26;
  TT_Size_Metrics *pTVar27;
  TT_GraphicsState *pTVar28;
  TT_Size_Metrics *pTVar29;
  TT_GraphicsState *pTVar30;
  uint uVar31;
  FT_Error error;
  int local_34;
  FT_ULong local_30;
  
  exec->face = face;
  exec->size = size;
  FVar15 = size->max_function_defs;
  exec->numFDefs = size->num_function_defs;
  exec->maxFDefs = FVar15;
  FVar15 = size->max_instruction_defs;
  exec->numIDefs = size->num_instruction_defs;
  exec->maxIDefs = FVar15;
  exec->FDefs = size->function_defs;
  exec->IDefs = size->instruction_defs;
  exec->pointSize = size->point_size;
  pTVar27 = &size->ttmetrics;
  pTVar29 = &exec->tt_metrics;
  for (lVar26 = 10; lVar26 != 0; lVar26 = lVar26 + -1) {
    pTVar29->x_ratio = pTVar27->x_ratio;
    pTVar27 = (TT_Size_Metrics *)&pTVar27->y_ratio;
    pTVar29 = (TT_Size_Metrics *)&pTVar29->y_ratio;
  }
  pFVar4 = size->metrics;
  (exec->metrics).max_advance = pFVar4->max_advance;
  FVar16 = pFVar4->x_ppem;
  FVar17 = pFVar4->y_ppem;
  uVar18 = *(undefined4 *)&pFVar4->field_0x4;
  FVar6 = pFVar4->x_scale;
  FVar7 = pFVar4->y_scale;
  FVar8 = pFVar4->ascender;
  FVar9 = pFVar4->height;
  (exec->metrics).descender = pFVar4->descender;
  (exec->metrics).height = FVar9;
  (exec->metrics).y_scale = FVar7;
  (exec->metrics).ascender = FVar8;
  (exec->metrics).x_ppem = FVar16;
  (exec->metrics).y_ppem = FVar17;
  *(undefined4 *)&(exec->metrics).field_0x4 = uVar18;
  (exec->metrics).x_scale = FVar6;
  FVar15 = size->max_ins;
  exec->maxFunc = size->max_func;
  exec->maxIns = FVar15;
  lVar26 = 0;
  do {
    puVar1 = (undefined8 *)((long)&size->codeRangeTable[0].base + lVar26);
    uVar10 = puVar1[1];
    puVar2 = (undefined8 *)((long)&exec->codeRangeTable[0].base + lVar26);
    *puVar2 = *puVar1;
    puVar2[1] = uVar10;
    lVar26 = lVar26 + 0x10;
  } while (lVar26 != 0x30);
  pTVar28 = &size->GS;
  pTVar30 = &exec->GS;
  for (lVar26 = 0xc; lVar26 != 0; lVar26 = lVar26 + -1) {
    FVar16 = pTVar28->rp1;
    FVar17 = pTVar28->rp2;
    FVar19 = (pTVar28->dualVector).x;
    pTVar30->rp0 = pTVar28->rp0;
    pTVar30->rp1 = FVar16;
    pTVar30->rp2 = FVar17;
    (pTVar30->dualVector).x = FVar19;
    pTVar28 = (TT_GraphicsState *)&(pTVar28->dualVector).y;
    pTVar30 = (TT_GraphicsState *)&(pTVar30->dualVector).y;
  }
  exec->cvtSize = size->cvt_size;
  exec->cvt = size->cvt;
  exec->storeSize = size->storage_size;
  exec->storage = size->storage;
  FVar16 = (size->twilight).max_points;
  FVar20 = (size->twilight).max_contours;
  FVar17 = (size->twilight).n_points;
  FVar21 = (size->twilight).n_contours;
  pFVar11 = (size->twilight).org;
  pFVar12 = (size->twilight).cur;
  pFVar13 = (size->twilight).orus;
  pFVar25 = (size->twilight).tags;
  pFVar14 = (size->twilight).contours;
  FVar22 = (size->twilight).first_point;
  uVar23 = *(undefined6 *)&(size->twilight).field_0x3a;
  (exec->twilight).memory = (size->twilight).memory;
  (exec->twilight).max_points = FVar16;
  (exec->twilight).max_contours = FVar20;
  (exec->twilight).n_points = FVar17;
  (exec->twilight).n_contours = FVar21;
  (exec->twilight).org = pFVar11;
  (exec->twilight).cur = pFVar12;
  (exec->twilight).orus = pFVar13;
  (exec->twilight).tags = pFVar25;
  (exec->twilight).contours = pFVar14;
  (exec->twilight).first_point = FVar22;
  *(undefined6 *)&(exec->twilight).field_0x3a = uVar23;
  memset(&exec->zp0,0,0xc0);
  local_30 = exec->stackSize;
  FVar24 = Update_Max(exec->memory,&local_30,8,&exec->stack,
                      (ulong)(face->max_profile).maxStackElements + 0x20);
  exec->stackSize = local_30;
  if (FVar24 == 0) {
    uVar31 = exec->glyphSize;
    uVar3 = (face->max_profile).maxSizeOfInstructions;
    if ((ulong)uVar31 < (ulong)uVar3) {
      pFVar25 = (FT_Byte *)
                ft_mem_qrealloc(exec->memory,1,(ulong)uVar31,(ulong)uVar3,exec->glyphIns,&local_34);
      exec->glyphIns = pFVar25;
      if (local_34 != 0) {
        exec->glyphSize = uVar31;
        return local_34;
      }
      uVar31 = (uint)uVar3;
    }
    exec->glyphSize = uVar31;
    (exec->pts).n_points = 0;
    (exec->pts).n_contours = 0;
    pFVar11 = (exec->pts).org;
    pFVar12 = (exec->pts).cur;
    pFVar13 = (exec->pts).orus;
    pFVar25 = (exec->pts).tags;
    FVar16 = (exec->pts).first_point;
    uVar23 = *(undefined6 *)&(exec->pts).field_0x3a;
    (exec->zp1).contours = (exec->pts).contours;
    (exec->zp1).first_point = FVar16;
    *(undefined6 *)&(exec->zp1).field_0x3a = uVar23;
    (exec->zp1).orus = pFVar13;
    (exec->zp1).tags = pFVar25;
    (exec->zp1).org = pFVar11;
    (exec->zp1).cur = pFVar12;
    (exec->zp1).memory = (exec->pts).memory;
    FVar20 = (exec->pts).max_contours;
    (exec->zp1).max_points = (exec->pts).max_points;
    (exec->zp1).max_contours = FVar20;
    FVar20 = (exec->pts).n_contours;
    (exec->zp1).n_points = (exec->pts).n_points;
    (exec->zp1).n_contours = FVar20;
    pFVar5 = (exec->pts).memory;
    FVar17 = (exec->pts).max_points;
    FVar20 = (exec->pts).max_contours;
    FVar22 = (exec->pts).n_points;
    FVar21 = (exec->pts).n_contours;
    pFVar11 = (exec->pts).org;
    pFVar12 = (exec->pts).cur;
    pFVar13 = (exec->pts).orus;
    pFVar25 = (exec->pts).tags;
    FVar16 = (exec->pts).first_point;
    uVar23 = *(undefined6 *)&(exec->pts).field_0x3a;
    (exec->zp2).contours = (exec->pts).contours;
    (exec->zp2).first_point = FVar16;
    *(undefined6 *)&(exec->zp2).field_0x3a = uVar23;
    (exec->zp2).orus = pFVar13;
    (exec->zp2).tags = pFVar25;
    (exec->zp2).org = pFVar11;
    (exec->zp2).cur = pFVar12;
    (exec->zp2).memory = pFVar5;
    (exec->zp2).max_points = FVar17;
    (exec->zp2).max_contours = FVar20;
    (exec->zp2).n_points = FVar22;
    (exec->zp2).n_contours = FVar21;
    pFVar5 = (exec->pts).memory;
    FVar17 = (exec->pts).max_points;
    FVar20 = (exec->pts).max_contours;
    FVar22 = (exec->pts).n_points;
    FVar21 = (exec->pts).n_contours;
    pFVar11 = (exec->pts).org;
    pFVar12 = (exec->pts).cur;
    pFVar13 = (exec->pts).orus;
    pFVar25 = (exec->pts).tags;
    FVar16 = (exec->pts).first_point;
    uVar23 = *(undefined6 *)&(exec->pts).field_0x3a;
    (exec->zp0).contours = (exec->pts).contours;
    (exec->zp0).first_point = FVar16;
    *(undefined6 *)&(exec->zp0).field_0x3a = uVar23;
    (exec->zp0).orus = pFVar13;
    (exec->zp0).tags = pFVar25;
    (exec->zp0).org = pFVar11;
    (exec->zp0).cur = pFVar12;
    (exec->zp0).memory = pFVar5;
    (exec->zp0).max_points = FVar17;
    (exec->zp0).max_contours = FVar20;
    (exec->zp0).n_points = FVar22;
    (exec->zp0).n_contours = FVar21;
    exec->instruction_trap = '\0';
    FVar24 = 0;
  }
  return FVar24;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  TT_Load_Context( TT_ExecContext  exec,
                   TT_Face         face,
                   TT_Size         size )
  {
    FT_Int          i;
    FT_ULong        tmp;
    TT_MaxProfile*  maxp;
    FT_Error        error;


    exec->face = face;
    maxp       = &face->max_profile;
    exec->size = size;

    if ( size )
    {
      exec->numFDefs   = size->num_function_defs;
      exec->maxFDefs   = size->max_function_defs;
      exec->numIDefs   = size->num_instruction_defs;
      exec->maxIDefs   = size->max_instruction_defs;
      exec->FDefs      = size->function_defs;
      exec->IDefs      = size->instruction_defs;
      exec->pointSize  = size->point_size;
      exec->tt_metrics = size->ttmetrics;
      exec->metrics    = *size->metrics;

      exec->maxFunc    = size->max_func;
      exec->maxIns     = size->max_ins;

      for ( i = 0; i < TT_MAX_CODE_RANGES; i++ )
        exec->codeRangeTable[i] = size->codeRangeTable[i];

      /* set graphics state */
      exec->GS = size->GS;

      exec->cvtSize = size->cvt_size;
      exec->cvt     = size->cvt;

      exec->storeSize = size->storage_size;
      exec->storage   = size->storage;

      exec->twilight  = size->twilight;

      /* In case of multi-threading it can happen that the old size object */
      /* no longer exists, thus we must clear all glyph zone references.   */
      FT_ZERO( &exec->zp0 );
      exec->zp1 = exec->zp0;
      exec->zp2 = exec->zp0;
    }

    /* XXX: We reserve a little more elements on the stack to deal safely */
    /*      with broken fonts like arialbs, courbs, timesbs, etc.         */
    tmp = (FT_ULong)exec->stackSize;
    error = Update_Max( exec->memory,
                        &tmp,
                        sizeof ( FT_F26Dot6 ),
                        (void*)&exec->stack,
                        maxp->maxStackElements + 32 );
    exec->stackSize = (FT_Long)tmp;
    if ( error )
      return error;

    tmp = (FT_ULong)exec->glyphSize;
    error = Update_Max( exec->memory,
                        &tmp,
                        sizeof ( FT_Byte ),
                        (void*)&exec->glyphIns,
                        maxp->maxSizeOfInstructions );
    exec->glyphSize = (FT_UInt)tmp;
    if ( error )
      return error;

    exec->pts.n_points   = 0;
    exec->pts.n_contours = 0;

    exec->zp1 = exec->pts;
    exec->zp2 = exec->pts;
    exec->zp0 = exec->pts;

    exec->instruction_trap = FALSE;

    return FT_Err_Ok;
  }